

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CPU.cpp
# Opt level: O0

void __thiscall CPU::LDX_IM(CPU *this)

{
  uint8_t uVar1;
  CPU *this_local;
  
  this->cycles = 2;
  uVar1 = GetByte(this);
  this->X = uVar1;
  (this->field_6).ps = (this->field_6).ps & 0xfd | (this->X == '\0') << 1;
  (this->field_6).ps =
       (this->field_6).ps & 0x7f | ((this->X & 0x80) != 0 && -1 < (int)(this->X & 0x80)) << 7;
  return;
}

Assistant:

void CPU::LDX_IM()
{
    cycles = 2;
    X = GetByte();
    Z = (X == 0);
    N = (X & 0b10000000) > 0;
}